

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::Temp::clear(Temp *this)

{
  bool bVar1;
  long *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  if (*in_RDI != 0) {
    spx_free<int*>((int **)0x28b473);
  }
  if (in_RDI[4] != 0) {
    spx_free<int*>((int **)0x28b48d);
  }
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(unaff_retaddr);
  if (!bVar1) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x28b4ad);
  }
  if (in_RDI[10] != 0) {
    spx_free<soplex::CLUFactor<double>::Pring*>((Pring **)0x28b4c7);
  }
  if (in_RDI[0xb] != 0) {
    spx_free<soplex::CLUFactor<double>::Pring*>((Pring **)0x28b4e1);
  }
  if (in_RDI[0xc] != 0) {
    spx_free<soplex::CLUFactor<double>::Pring*>((Pring **)0x28b4fb);
  }
  if (in_RDI[0xd] != 0) {
    spx_free<soplex::CLUFactor<double>::Pring*>((Pring **)0x28b515);
  }
  return;
}

Assistant:

void CLUFactor<R>::Temp::clear()
{
   if(s_mark != nullptr)
      spx_free(s_mark);

   if(s_cact != nullptr)
      spx_free(s_cact);

   if(!s_max.empty())
      s_max.clear();

   if(pivot_col != nullptr)
      spx_free(pivot_col);

   if(pivot_colNZ != nullptr)
      spx_free(pivot_colNZ);

   if(pivot_row != nullptr)
      spx_free(pivot_row);

   if(pivot_rowNZ != nullptr)
      spx_free(pivot_rowNZ);
}